

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

error_or_n<int,_byte_span> * __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::get_span_impl(error_or_n<int,_byte_span> *__return_storage_ptr__,
               buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
               *this,int io,byte_span *sp)

{
  uchar uVar1;
  long __n;
  bool bVar2;
  index_type iVar3;
  uchar *puVar4;
  reference peVar5;
  type_conflict *ptVar6;
  type *lhs;
  long *plVar7;
  pointer peVar8;
  pointer peVar9;
  pointer peVar10;
  error_code eVar11;
  byte local_152;
  span<unsigned_char,__1L> local_138;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_120;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_110;
  index_type local_100;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_f8;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_e8;
  difference_type local_d8;
  long local_d0;
  long to_copy;
  span<unsigned_char,__1L> local_b8;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_a0;
  type *local_90;
  type *end;
  uint local_78;
  error_category *local_70;
  undefined1 local_68 [8];
  error_or_n<int,_gsl::span<std::uint8_t>::iterator> x;
  pointer local_40;
  undefined1 local_38 [8];
  byte_span available;
  byte_span *sp_local;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  *pbStack_18;
  int io_local;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  *this_local;
  
  local_38 = (undefined1  [8])(sp->storage_).super_extent_type<_1L>.size_;
  available.storage_.super_extent_type<_1L>.size_ = (index_type)(sp->storage_).data_;
  available.storage_.data_ = (pointer)sp;
  sp_local._4_4_ = io;
  pbStack_18 = this;
  this_local = (buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                *)__return_storage_ptr__;
  bVar2 = maybe::operator_cast_to_bool((maybe *)&this->push_);
  if ((bVar2) &&
     (iVar3 = pstore::gsl::span<unsigned_char,_-1L>::size
                        ((span<unsigned_char,__1L> *)available.storage_.data_), 0 < iVar3)) {
    puVar4 = maybe<unsigned_char,_void>::operator*(&this->push_);
    uVar1 = *puVar4;
    peVar5 = pstore::gsl::span<unsigned_char,_-1L>::operator[]
                       ((span<unsigned_char,__1L> *)available.storage_.data_,0);
    *peVar5 = uVar1;
    maybe<unsigned_char,_void>::reset(&this->push_);
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         pstore::gsl::span<unsigned_char,_-1L>::subspan((span<unsigned_char,__1L> *)local_38,1,-1);
    local_38 = (undefined1  [8])x._24_8_;
    available.storage_.super_extent_type<_1L>.size_ = (index_type)local_40;
  }
  do {
    bVar2 = pstore::gsl::span<unsigned_char,_-1L>::empty((span<unsigned_char,__1L> *)local_38);
    local_152 = 0;
    if (!bVar2) {
      local_152 = this->is_eof_ ^ 0xff;
    }
    if ((local_152 & 1) == 0) {
      peVar8 = pstore::gsl::span<unsigned_char,_-1L>::data
                         ((span<unsigned_char,__1L> *)available.storage_.data_);
      peVar9 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_38);
      peVar10 = pstore::gsl::span<unsigned_char,_-1L>::data
                          ((span<unsigned_char,__1L> *)available.storage_.data_);
      pstore::gsl::span<unsigned_char,_-1L>::span(&local_138,peVar8,(long)peVar9 - (long)peVar10);
      error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
      error_or<int&,pstore::gsl::span<unsigned_char,_1l>>
                ((error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>> *)
                 __return_storage_ptr__,(long)&sp_local + 4,&local_138);
      return __return_storage_ptr__;
    }
    bVar2 = pstore::gsl::details::operator==(&this->pos_,&this->end_);
    if (bVar2) {
      std::
      function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
      ::operator()((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                    *)local_68,&this->refill_,sp_local._4_4_,&this->span_);
      bVar2 = pstore::error_or::operator_cast_to_bool((error_or *)local_68);
      if (bVar2) {
        ptVar6 = get<0ul,int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                           ((error_or_n<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char>,_false>_>
                             *)local_68);
        sp_local._4_4_ = *ptVar6;
        lhs = get<1ul,int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                        ((error_or_n<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char>,_false>_>
                          *)local_68);
        local_90 = lhs;
        pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&local_a0);
        bVar2 = pstore::gsl::details::operator==(lhs,&local_a0);
        if (bVar2) {
          this->is_eof_ = true;
          peVar8 = pstore::gsl::span<unsigned_char,_-1L>::data
                             ((span<unsigned_char,__1L> *)available.storage_.data_);
          peVar9 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_38)
          ;
          peVar10 = pstore::gsl::span<unsigned_char,_-1L>::data
                              ((span<unsigned_char,__1L> *)available.storage_.data_);
          pstore::gsl::span<unsigned_char,_-1L>::span(&local_b8,peVar8,(long)peVar9 - (long)peVar10)
          ;
          error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
          error_or<int&,pstore::gsl::span<unsigned_char,_1l>>
                    ((error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>> *)
                     __return_storage_ptr__,(long)&sp_local + 4,&local_b8);
          end._0_4_ = 1;
        }
        else {
          pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
          operator=(&this->end_,local_90);
          pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&to_copy);
          pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
          operator=(&this->pos_,
                    (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&to_copy);
          end._0_4_ = 0;
        }
      }
      else {
        eVar11 = error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
                 ::get_error((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                              *)local_68);
        local_78 = eVar11._M_value;
        eVar11._4_4_ = 0;
        eVar11._M_value = local_78;
        local_70 = eVar11._M_cat;
        error_or<std::tuple<int,_pstore::gsl::span<unsigned_char,_-1L>_>_>::error_or
                  (__return_storage_ptr__,eVar11);
        end._0_4_ = 1;
      }
      error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
      ::~error_or((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                   *)local_68);
      if ((int)end != 0) {
        return __return_storage_ptr__;
      }
    }
    check_invariants(this);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_e8,&this->pos_);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_f8,&this->end_);
    local_d8 = std::
               distance<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                         (&local_e8,&local_f8);
    local_100 = pstore::gsl::span<unsigned_char,_-1L>::size((span<unsigned_char,__1L> *)local_38);
    plVar7 = std::min<long>(&local_d8,&local_100);
    local_d0 = *plVar7;
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_110,&this->pos_);
    __n = local_d0;
    peVar8 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_38);
    std::
    copy_n<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,long,unsigned_char*>
              (&local_110,__n,peVar8);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+=
              (&this->pos_,local_d0);
    local_120 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                pstore::gsl::span<unsigned_char,_-1L>::subspan
                          ((span<unsigned_char,__1L> *)local_38,local_d0,-1);
    local_38 = (undefined1  [8])local_120.super_extent_type<_1L>.size_;
    available.storage_.super_extent_type<_1L>.size_ = (index_type)local_120.data_;
  } while( true );
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span_impl (IO io, byte_span const & sp)
            -> error_or_n<IO, byte_span> {

            auto available = sp;
            if (push_ && sp.size () > 0) {
                sp[0] = *push_;
                push_.reset ();
                available = available.subspan (1);
            }

            while (!available.empty () && !is_eof_) {
                if (pos_ == end_) {
                    // Refill the buffer.
                    error_or_n<IO, gsl::span<std::uint8_t>::iterator> x = refill_ (io, span_);
                    if (!x) {
                        return error_or_n<IO, byte_span>{x.get_error ()};
                    }
                    io = std::move (get<0> (x));
                    auto const & end = get<1> (x);
                    if (end == span_.begin ()) {
                        // that's the end of the source data.
                        is_eof_ = true;
                        return error_or_n<IO, byte_span>{
                            in_place, io, byte_span{sp.data (), available.data () - sp.data ()}};
                    }

                    end_ = end;
                    pos_ = span_.begin ();
                }

                // If we have bytes in the buffer, copy as many as we can.

                this->check_invariants ();
                auto const to_copy = std::min (std::distance (pos_, end_), available.size ());
                std::copy_n (pos_, to_copy, available.data ());
                pos_ += to_copy;
                available = available.subspan (to_copy);
            }
            return error_or_n<IO, byte_span>{in_place, io,
                                             byte_span{sp.data (), available.data () - sp.data ()}};
        }